

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<testing::ActionInterface<test_result_(bool)>_> * __thiscall
testing::internal::linked_ptr<testing::ActionInterface<test_result_(bool)>_>::operator=
          (linked_ptr<testing::ActionInterface<test_result_(bool)>_> *this,
          linked_ptr<testing::ActionInterface<test_result_(bool)>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::ActionInterface<test_result(bool)>>::
    copy<testing::ActionInterface<test_result(bool)>>
              ((linked_ptr<testing::ActionInterface<test_result(bool)>> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }